

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicCapability>
          (Orphan<capnp::DynamicValue> *this,Orphan<capnp::DynamicCapability> *other)

{
  OrphanBuilder *builder;
  Client local_70;
  Builder local_58;
  Orphan<capnp::DynamicCapability> *local_18;
  Orphan<capnp::DynamicCapability> *other_local;
  Orphan<capnp::DynamicValue> *this_local;
  
  local_18 = other;
  other_local = (Orphan<capnp::DynamicCapability> *)this;
  capnp::Orphan<capnp::DynamicCapability>::get(&local_70,other);
  DynamicValue::Builder::Builder(&local_58,&local_70);
  builder = kj::mv<capnp::_::OrphanBuilder>(&local_18->builder);
  Orphan(this,&local_58,builder);
  DynamicValue::Builder::~Builder(&local_58);
  DynamicCapability::Client::~Client(&local_70);
  return;
}

Assistant:

inline Orphan<DynamicValue>::Orphan(Orphan<T>&& other)
    : Orphan(other.get(), kj::mv(other.builder)) {}